

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl_settings.cpp
# Opt level: O1

void OpenGLSettings::gl_clear(void)

{
  (*glad_glViewport)(0,0,(int)AkarinGLFW::window_dimension.field_0.x,
                     (int)AkarinGLFW::window_dimension.field_1.y);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClear)((enable_depth_buffer | 0x40) << 8);
  return;
}

Assistant:

void OpenGLSettings::gl_clear() noexcept
{
    glViewport(0, 0,
               static_cast<GLsizei>(AkarinGLFW::window_dimension.x),
               static_cast<GLsizei>(AkarinGLFW::window_dimension.y));
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
    glClear(get_clear_mask());
}